

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

void sg_init_shader(sg_shader shd_id,sg_shader_desc *desc)

{
  _sg_shader_t *shd_00;
  _sg_shader_t *shd;
  sg_shader_desc desc_def;
  sg_shader_desc *desc_local;
  sg_shader shd_id_local;
  
  desc_def._3040_8_ = desc;
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3e16,"void sg_init_shader(sg_shader, const sg_shader_desc *)");
  }
  _sg_shader_desc_defaults((sg_shader_desc *)&shd,desc);
  shd_00 = _sg_lookup_shader(&_sg.pools,shd_id.id);
  if (shd_00 != (_sg_shader_t *)0x0) {
    if ((shd_00->slot).state == SG_RESOURCESTATE_ALLOC) {
      _sg_init_shader(shd_00,(sg_shader_desc *)&shd);
      if (((shd_00->slot).state != SG_RESOURCESTATE_VALID) &&
         ((shd_00->slot).state != SG_RESOURCESTATE_FAILED)) {
        __assert_fail("(shd->slot.state == SG_RESOURCESTATE_VALID) || (shd->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                      ,0x3e1c,"void sg_init_shader(sg_shader, const sg_shader_desc *)");
      }
    }
    else {
      _sg_log("sg_init_shader: shader must be in alloc state\n");
    }
  }
  return;
}

Assistant:

inline void sg_init_shader(sg_shader shd_id, const sg_shader_desc& desc) { return sg_init_shader(shd_id, &desc); }